

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetDamage(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  int iVar1;
  sector_t *psVar2;
  uint uVar3;
  int iVar4;
  FName local_3c;
  FSectorTagIterator itr;
  
  itr.start = 0;
  if (arg0 != 0) {
    itr.start = tagManager.TagHashFirst[(byte)arg0];
  }
  iVar4 = 0x100;
  if ((uint)arg1 < 0x32) {
    iVar4 = 5;
  }
  iVar1 = 1;
  if (arg1 < 0x32) {
    iVar1 = 0x20;
  }
  itr.searchtag = arg0;
  if (arg1 < 0x14) {
    iVar4 = 0;
  }
  while (uVar3 = FSectorTagIterator::Next(&itr), psVar2 = sectors, -1 < (int)uVar3) {
    if (arg3 < 1) {
      arg3 = iVar1;
      arg4 = iVar4;
    }
    sectors[uVar3].damageamount = (int)(short)arg1;
    MODtoDamageType((int)&local_3c);
    psVar2[uVar3].damagetype.super_FName.Index = local_3c.Index;
    psVar2[uVar3].damageinterval = (short)arg3;
    psVar2[uVar3].leakydamage = (short)arg4;
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetDamage)
// Sector_SetDamage (tag, amount, mod, interval, leaky)
{
	// The sector still stores the mod in its old format because
	// adding an FName to the sector_t structure might cause
	// problems by adding an unwanted constructor.
	// Since it doesn't really matter whether the type is translated
	// here or in P_PlayerInSpecialSector I think it's the best solution.
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg3 <= 0)	// emulate old and hacky method to handle leakiness.
		{
			if (arg1 < 20)
			{
				arg4 = 0;
				arg3 = 32;
			}
			else if (arg1 < 50)
			{
				arg4 = 5;
				arg3 = 32;
			}
			else
			{
				arg4 = 256;
				arg3 = 1;
			}
		}
		sectors[secnum].damageamount = (short)arg1;
		sectors[secnum].damagetype = MODtoDamageType(arg2);
		sectors[secnum].damageinterval = (short)arg3;
		sectors[secnum].leakydamage = (short)arg4;
	}
	return true;
}